

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O0

void stream_encoder_end(lzma_coder_conflict2 *coder,lzma_allocator *allocator)

{
  long local_20;
  size_t i;
  lzma_allocator *allocator_local;
  lzma_coder_conflict2 *coder_local;
  
  lzma_next_end((lzma_next_coder *)&coder->block_encoder,allocator);
  lzma_next_end((lzma_next_coder *)&coder->index_encoder,allocator);
  lzma_index_end(coder->index,allocator);
  for (local_20 = 0; coder->filters[local_20].id != 0xffffffffffffffff; local_20 = local_20 + 1) {
    lzma_free(coder->filters[local_20].options,allocator);
  }
  lzma_free(coder,allocator);
  return;
}

Assistant:

static void
stream_encoder_end(lzma_coder *coder, lzma_allocator *allocator)
{
	size_t i;

	lzma_next_end(&coder->block_encoder, allocator);
	lzma_next_end(&coder->index_encoder, allocator);
	lzma_index_end(coder->index, allocator);

	for (i = 0; coder->filters[i].id != LZMA_VLI_UNKNOWN; ++i)
		lzma_free(coder->filters[i].options, allocator);

	lzma_free(coder, allocator);
	return;
}